

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall boost::python::list::append<short>(list *this,short *x)

{
  object local_10;
  
  local_10.super_object_base.m_ptr =
       (object_base)api::object_initializer_impl<false,_false>::get<short>(x);
  detail::list_base::append(&this->super_list_base,&local_10);
  *(long *)local_10.super_object_base.m_ptr = *(long *)local_10.super_object_base.m_ptr + -1;
  if (*(long *)local_10.super_object_base.m_ptr == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

void append(T const& x)
    {
        base::append(object(x));
    }